

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpproto.c
# Opt level: O0

void do_pass(session_t *sess)

{
  int iVar1;
  passwd *ppVar2;
  long lVar3;
  char *__s1;
  char *encrypt_pass;
  spwd *sp;
  passwd *pw;
  session_t *sess_local;
  
  ppVar2 = getpwuid(sess->uid);
  if (ppVar2 == (passwd *)0x0) {
    ftp_relply(sess,0x212,"Login incorrect.");
  }
  else {
    lVar3 = getspnam(ppVar2->pw_name);
    if (lVar3 == 0) {
      ftp_relply(sess,0x212,"Login incorrect.");
    }
    else {
      __s1 = crypt(sess->cmd_arg,*(char **)(lVar3 + 8));
      iVar1 = strcmp(__s1,*(char **)(lVar3 + 8));
      if (iVar1 == 0) {
        iVar1 = setegid(ppVar2->pw_gid);
        if (iVar1 < 0) {
          perror("setegid");
          exit(1);
        }
        iVar1 = seteuid(ppVar2->pw_uid);
        if (iVar1 < 0) {
          perror("seteuid");
          exit(1);
        }
        signal(0x17,handle_sigurg);
        activate_sigurg(sess->ctrl_fd);
        umask(tunable_local_umask);
        chdir(ppVar2->pw_dir);
        ftp_relply(sess,0xe6,"Login successful.");
      }
      else {
        ftp_relply(sess,0x212,"Password incorrect.");
      }
    }
  }
  return;
}

Assistant:

static void do_pass(session_t *sess) {
  struct passwd *pw = getpwuid(sess->uid);
  if (pw == NULL) {
    ftp_relply(sess, FTP_LOGINERR, "Login incorrect.");
    return;
  }
  // only root can do this
  struct spwd *sp = getspnam(pw->pw_name);
  if (sp == NULL) {
    ftp_relply(sess, FTP_LOGINERR, "Login incorrect.");
    return;
  }

  // encrypt the sess passwd
  char *encrypt_pass = crypt(sess->cmd_arg, sp->sp_pwdp);
  if (strcmp(encrypt_pass, sp->sp_pwdp) != 0) {
    ftp_relply(sess, FTP_LOGINERR, "Password incorrect.");
    return;
  }
  // login successful,set process egid and euid
  if (setegid(pw->pw_gid) < 0) {
    ERR_EXIT("setegid");
  }

  if (seteuid(pw->pw_uid) < 0) {
    ERR_EXIT("seteuid");
  }

  signal(SIGURG, handle_sigurg);
  activate_sigurg(sess->ctrl_fd);

  umask(tunable_local_umask);

  chdir(pw->pw_dir);
  ftp_relply(sess, FTP_LOGINOK, "Login successful.");
}